

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_> *this)

{
  long lVar1;
  
  (this->super_TPZGeoEl).fMesh = (TPZGeoMesh *)0x0;
  (this->super_TPZGeoEl).fId = -1;
  (this->super_TPZGeoEl).fMatId = 0;
  (this->super_TPZGeoEl).fReference = (TPZCompEl *)0x0;
  *(undefined4 *)&(this->super_TPZGeoEl).fFatherIndex = 0xffffffff;
  *(undefined4 *)((long)&(this->super_TPZGeoEl).fFatherIndex + 4) = 0xffffffff;
  *(undefined4 *)&(this->super_TPZGeoEl).fIndex = 0xffffffff;
  *(undefined4 *)((long)&(this->super_TPZGeoEl).fIndex + 4) = 0xffffffff;
  (this->super_TPZGeoEl).fNumInterfaces = 0;
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_0188f5c0;
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::TPZGeoBlend(&this->fGeo);
  lVar1 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar1) =
         &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar1) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar1) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x48);
  this->fNeighbours[0].fGeoElIndex = -1;
  this->fNeighbours[0].fSide = -1;
  this->fNeighbours[1].fGeoElIndex = -1;
  this->fNeighbours[1].fSide = -1;
  this->fNeighbours[2].fGeoElIndex = -1;
  this->fNeighbours[2].fSide = -1;
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess():TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),
TPZGeoEl(){
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
}